

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::CordOutputStreamTest_DonatePartialCordBuffer_Test::TestBody
          (CordOutputStreamTest_DonatePartialCordBuffer_Test *this)

{
  byte bVar1;
  bool bVar2;
  undefined8 extraout_RAX;
  sbyte sVar3;
  ulong uVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  sbyte sVar6;
  int iVar7;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar8;
  char *message;
  pointer message_00;
  char *in_R9;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *unaff_R14;
  pointer *__ptr;
  Span<char> SVar9;
  string_view fragment;
  CordBuffer buffer;
  Cord cord;
  void *available_data;
  CordOutputStream output;
  AssertHelper local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_b9f6da03_for_Rep_1 local_98;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined1 local_78 [8];
  undefined1 auStack_70 [16];
  void *pvStack_60;
  undefined1 local_50 [16];
  Cord local_40 [2];
  byte local_20;
  undefined7 uStack_1f;
  
  local_98.long_rep.rep = absl::lts_20250127::cord_internal::CordRepFlat::NewImpl<4096ul>(500);
  ((CordRep *)&((local_98.long_rep.rep)->super_CordRep).length)->length = 0;
  if (((ulong)local_98.long_rep.rep & 1) == 0) {
    SVar9 = absl::lts_20250127::CordBuffer::Rep::long_available((Rep *)&local_98.long_rep);
    local_50._0_8_ = SVar9.ptr_;
  }
  else {
    SVar9 = absl::lts_20250127::CordBuffer::Rep::short_available((Rep *)&local_98.long_rep);
    local_50._0_8_ = SVar9.ptr_;
  }
  (((CordRepFlat *)(local_50._0_8_ + 0x50))->super_CordRep).length = 0x6161616161616161;
  *(undefined8 *)&(((CordRepFlat *)(local_50._0_8_ + 0x50))->super_CordRep).refcount =
       0x6161616161616161;
  (((CordRepFlat *)(local_50._0_8_ + 0x40))->super_CordRep).length = 0x6161616161616161;
  *(undefined8 *)&(((CordRepFlat *)(local_50._0_8_ + 0x40))->super_CordRep).refcount =
       0x6161616161616161;
  (((CordRepFlat *)(local_50._0_8_ + 0x30))->super_CordRep).length = 0x6161616161616161;
  *(undefined8 *)&(((CordRepFlat *)(local_50._0_8_ + 0x30))->super_CordRep).refcount =
       0x6161616161616161;
  (((CordRepFlat *)(local_50._0_8_ + 0x20))->super_CordRep).length = 0x6161616161616161;
  *(undefined8 *)&(((CordRepFlat *)(local_50._0_8_ + 0x20))->super_CordRep).refcount =
       0x6161616161616161;
  (((CordRepFlat *)(local_50._0_8_ + 0x10))->super_CordRep).length = 0x6161616161616161;
  *(undefined8 *)&(((CordRepFlat *)(local_50._0_8_ + 0x10))->super_CordRep).refcount =
       0x6161616161616161;
  (((CordRepFlat *)local_50._0_8_)->super_CordRep).length = 0x6161616161616161;
  *(undefined8 *)&(((CordRepFlat *)local_50._0_8_)->super_CordRep).refcount = 0x6161616161616161;
  *(undefined4 *)&(((CordRepFlat *)(local_50._0_8_ + 0x60))->super_CordRep).length = 0x61616161;
  if (((ulong)local_98.long_rep.rep & 1) != 0) {
LAB_00b3c53f:
    io::_GLOBAL__N_1::CordOutputStreamTest_DonatePartialCordBuffer_Test::TestBody();
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_b8 != (undefined1  [8])&local_a8) {
      operator_delete((void *)local_b8,local_a8._M_allocated_capacity + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(unaff_R14,local_80);
    }
    absl::lts_20250127::Cord::~Cord((Cord *)local_78);
    CordOutputStream::~CordOutputStream((CordOutputStream *)(local_50 + 8));
    absl::lts_20250127::CordBuffer::~CordBuffer((CordBuffer *)&local_98.long_rep);
    _Unwind_Resume(extraout_RAX);
  }
  bVar1 = ((local_98.long_rep.rep)->super_CordRep).tag;
  sVar6 = 0xc;
  if (bVar1 < 0xbb) {
    sVar6 = 6;
  }
  iVar8 = -0xb800d;
  if (bVar1 < 0xbb) {
    iVar8 = -0xe8d;
  }
  sVar3 = 3;
  if (0x42 < bVar1) {
    sVar3 = sVar6;
  }
  iVar7 = -0x1d;
  if (0x42 < bVar1) {
    iVar7 = iVar8;
  }
  uVar5 = ((uint)bVar1 << sVar3) + iVar7;
  if ((uVar5 < 100) ||
     (uVar4 = ((local_98.long_rep.rep)->super_CordRep).length + 100, (ulong)(long)(int)uVar5 < uVar4
     )) goto LAB_00b3c53f;
  ((local_98.long_rep.rep)->super_CordRep).length = uVar4;
  auStack_70._8_8_ = local_98.long_rep.rep;
  pvStack_60 = local_98.long_rep.padding;
  local_98.short_rep.raw_size = 1;
  CordOutputStream::CordOutputStream
            ((CordOutputStream *)(local_50 + 8),(CordBuffer *)(auStack_70 + 8),0);
  if ((auStack_70._8_8_ & 1) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete((CordRep *)auStack_70._8_8_);
  }
  CordOutputStream::Consume((CordOutputStream *)local_78);
  if ((Nonnull<CordRep_*>)auStack_70._0_8_ == (Nonnull<CordRep_*>)0x0 || (local_78[0] & 1) == 0) {
LAB_00b3c262:
    if ((Nonnull<CordRep_*>)auStack_70._0_8_ == (Nonnull<CordRep_*>)0x0 || (local_78[0] & 1) == 0) {
      if ((local_78[0] & 1) == 0) {
        local_b8 = (undefined1  [8])((ulong)(long)(char)local_78[0] >> 1);
        local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_78 + 1);
      }
      else {
        local_b8 = (undefined1  [8])((Nonnull<CordRep_*>)auStack_70._0_8_)->length;
        local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    else {
      local_b8 = (undefined1  [8])0x0;
      pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      absl::lts_20250127::Cord::GetFlatAux
                ((Nonnull<CordRep_*>)auStack_70._0_8_,(Nonnull<absl::string_view_*>)local_b8);
      local_80 = pbStack_b0;
    }
    local_88 = local_b8;
    local_b8 = (undefined1  [8])&local_a8;
    std::__cxx11::string::_M_construct((ulong)local_b8,'d');
    testing::internal::
    CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              ((internal *)&local_c8,"flat","std::string(100, \'a\')",
               (basic_string_view<char,_std::char_traits<char>_> *)local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    if (local_b8 != (undefined1  [8])&local_a8) {
      operator_delete((void *)local_b8,local_a8._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_b8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = anon_var_dwarf_a22956 + 5;
      }
      else {
        message = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0x409,message);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_b8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_b8 + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    local_c8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
    testing::internal::CmpHelperEQ<char_const*,void*>
              ((internal *)local_b8,"flat.data()","available_data",(char **)&local_c8,
               (void **)local_50);
    if (local_b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_c8);
      if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message_00 = anon_var_dwarf_a22956 + 5;
      }
      else {
        message_00 = (pbStack_b0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0x40a,message_00);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_head_impl
          != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c8._M_head_impl + 8))();
      }
    }
    if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b3c4f5;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pbStack_b0;
    __ptr_00 = pbStack_b0;
  }
  else {
    local_b8 = (undefined1  [8])0x0;
    pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar2 = absl::lts_20250127::Cord::GetFlatAux
                      ((Nonnull<CordRep_*>)auStack_70._0_8_,(Nonnull<absl::string_view_*>)local_b8);
    if (bVar2) goto LAB_00b3c262;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_80;
    local_88 = (undefined1  [8])((ulong)local_88 & 0xffffffffffffff00);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_88,(AssertionResult *)"cord.TryFlat()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x407,(char *)local_b8);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_b8 != (undefined1  [8])&local_a8) {
      operator_delete((void *)local_b8,local_a8._M_allocated_capacity + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
    __ptr_00 = local_80;
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b3c4f5;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_00b3c4f5:
  absl::lts_20250127::Cord::~Cord((Cord *)local_78);
  if ((local_20 & 1) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete((CordRep *)CONCAT71(uStack_1f,local_20));
  }
  absl::lts_20250127::Cord::~Cord(local_40);
  if (((ulong)local_98.long_rep.rep & 1) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete(&(local_98.long_rep.rep)->super_CordRep);
  }
  return;
}

Assistant:

bool IoTest::WriteToOutput(ZeroCopyOutputStream* output, const void* data,
                           int size) {
  const uint8_t* in = reinterpret_cast<const uint8_t*>(data);
  int in_size = size;

  void* out;
  int out_size;

  while (true) {
    if (!output->Next(&out, &out_size)) {
      return false;
    }
    EXPECT_GT(out_size, 0);

    if (in_size <= out_size) {
      memcpy(out, in, in_size);
      output->BackUp(out_size - in_size);
      return true;
    }

    memcpy(out, in, out_size);
    in += out_size;
    in_size -= out_size;
  }
}